

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O2

void extend_lines(uint8_t *buf,int width,int height,int stride,int extend,int use_highbitdepth)

{
  undefined2 uVar1;
  long lVar2;
  uint8_t *puVar3;
  int iVar4;
  size_t i;
  long lVar5;
  
  lVar2 = (long)width;
  puVar3 = buf + lVar2 * 2;
  for (iVar4 = 0; iVar4 != 2; iVar4 = iVar4 + 1) {
    if (stride == 0) {
      *(uint *)(buf + -4) = (uint)*buf * 0x1010101;
      *(uint *)(buf + lVar2) = (uint)buf[lVar2 + -1] * 0x1010101;
    }
    else {
      uVar1 = *(undefined2 *)buf;
      for (lVar5 = -8; lVar5 != 0; lVar5 = lVar5 + 2) {
        *(undefined2 *)(buf + lVar5) = uVar1;
      }
      uVar1 = *(undefined2 *)(buf + lVar2 * 2 + -2);
      for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
        *(undefined2 *)(puVar3 + lVar5 * 2) = uVar1;
      }
    }
    buf = buf + height;
    puVar3 = puVar3 + height;
  }
  return;
}

Assistant:

static void extend_lines(uint8_t *buf, int width, int height, int stride,
                         int extend, int use_highbitdepth) {
  for (int i = 0; i < height; ++i) {
    if (use_highbitdepth) {
      uint16_t *buf16 = (uint16_t *)buf;
      aom_memset16(buf16 - extend, buf16[0], extend);
      aom_memset16(buf16 + width, buf16[width - 1], extend);
    } else {
      memset(buf - extend, buf[0], extend);
      memset(buf + width, buf[width - 1], extend);
    }
    buf += stride;
  }
}